

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.cpp
# Opt level: O2

int zmq::tcp_write(fd_t s_,void *data_,size_t size_)

{
  uint __errnum;
  ssize_t sVar1;
  uint *puVar2;
  char *errmsg_;
  
  sVar1 = send(s_,data_,size_,0);
  if (sVar1 != -1) {
    return (int)sVar1;
  }
  puVar2 = (uint *)__errno_location();
  __errnum = *puVar2;
  if (__errnum < 0xf) {
    if ((0x810U >> (__errnum & 0x1f) & 1) != 0) {
      return 0;
    }
    if ((0x7200U >> (__errnum & 0x1f) & 1) != 0) goto LAB_0017d01f;
  }
  if (0x12 < __errnum - 0x58) {
    return -1;
  }
  if ((0x40087U >> (__errnum - 0x58 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_0017d01f:
  errmsg_ = strerror(__errnum);
  fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp.cpp"
          ,0x101);
  fflush(_stderr);
  zmq_abort(errmsg_);
  return -1;
}

Assistant:

int zmq::tcp_write (fd_t s_, const void *data_, size_t size_)
{
#ifdef ZMQ_HAVE_WINDOWS

    const int nbytes = send (s_, (char *) data_, static_cast<int> (size_), 0);

    //  If not a single byte can be written to the socket in non-blocking mode
    //  we'll get an error (this may happen during the speculative write).
    const int last_error = WSAGetLastError ();
    if (nbytes == SOCKET_ERROR && last_error == WSAEWOULDBLOCK)
        return 0;

    //  Signalise peer failure.
    if (nbytes == SOCKET_ERROR
        && (last_error == WSAENETDOWN || last_error == WSAENETRESET
            || last_error == WSAEHOSTUNREACH || last_error == WSAECONNABORTED
            || last_error == WSAETIMEDOUT || last_error == WSAECONNRESET))
        return -1;

    //  Circumvent a Windows bug:
    //  See https://support.microsoft.com/en-us/kb/201213
    //  See https://zeromq.jira.com/browse/LIBZMQ-195
    if (nbytes == SOCKET_ERROR && last_error == WSAENOBUFS)
        return 0;

    wsa_assert (nbytes != SOCKET_ERROR);
    return nbytes;

#else
    ssize_t nbytes = send (s_, static_cast<const char *> (data_), size_, 0);

    //  Several errors are OK. When speculative write is being done we may not
    //  be able to write a single byte from the socket. Also, SIGSTOP issued
    //  by a debugging tool can result in EINTR error.
    if (nbytes == -1
        && (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR))
        return 0;

    //  Signalise peer failure.
    if (nbytes == -1) {
#if !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EACCES && errno != EBADF && errno != EDESTADDRREQ
                      && errno != EFAULT && errno != EISCONN
                      && errno != EMSGSIZE && errno != ENOMEM
                      && errno != ENOTSOCK && errno != EOPNOTSUPP);
#else
        errno_assert (errno != EACCES && errno != EDESTADDRREQ
                      && errno != EFAULT && errno != EISCONN
                      && errno != EMSGSIZE && errno != ENOMEM
                      && errno != ENOTSOCK && errno != EOPNOTSUPP);
#endif
        return -1;
    }

    return static_cast<int> (nbytes);

#endif
}